

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

uint32 chksum_accum(void *buf,int32 el_sz,int32 n_el,uint32 sum)

{
  uint32 *i32;
  uint16 *i16;
  uint8 *i8;
  int32 i;
  uint32 sum_local;
  int32 n_el_local;
  int32 el_sz_local;
  void *buf_local;
  
  i8._4_4_ = sum;
  if (el_sz == 1) {
    for (i8._0_4_ = 0; (int)i8 < n_el; i8._0_4_ = (int)i8 + 1) {
      i8._4_4_ = (i8._4_4_ << 5 | i8._4_4_ >> 0x1b) + (uint)*(byte *)((long)buf + (long)(int)i8);
    }
  }
  else if (el_sz == 2) {
    for (i8._0_4_ = 0; (int)i8 < n_el; i8._0_4_ = (int)i8 + 1) {
      i8._4_4_ = (i8._4_4_ << 10 | i8._4_4_ >> 0x16) +
                 (uint)*(ushort *)((long)buf + (long)(int)i8 * 2);
    }
  }
  else {
    if (el_sz != 4) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
              ,0x122,"Unsupported elemsize for checksum: %d\n",(ulong)(uint)el_sz);
      exit(1);
    }
    for (i8._0_4_ = 0; (int)i8 < n_el; i8._0_4_ = (int)i8 + 1) {
      i8._4_4_ = (i8._4_4_ << 0x14 | i8._4_4_ >> 0xc) + *(int *)((long)buf + (long)(int)i8 * 4);
    }
  }
  return i8._4_4_;
}

Assistant:

static uint32
chksum_accum(const void *buf, int32 el_sz, int32 n_el, uint32 sum)
{
    int32 i;
    uint8 *i8;
    uint16 *i16;
    uint32 *i32;

    switch (el_sz) {
    case 1:
        i8 = (uint8 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 5 | sum >> 27) + i8[i];
        break;
    case 2:
        i16 = (uint16 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 10 | sum >> 22) + i16[i];
        break;
    case 4:
        i32 = (uint32 *) buf;
        for (i = 0; i < n_el; i++)
            sum = (sum << 20 | sum >> 12) + i32[i];
        break;
    default:
        E_FATAL("Unsupported elemsize for checksum: %d\n", el_sz);
        break;
    }

    return sum;
}